

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Main.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  int iVar1;
  int port;
  int local_1084;
  string logPath;
  string local_1060;
  Server myHTTPServer;
  EventLoop mainLoop;
  undefined8 *local_60 [6];
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&logPath,"./WebServer.log",(allocator<char> *)&mainLoop);
  local_1084 = 4;
  port = 0x1f98;
  do {
    while (iVar1 = getopt(argc,argv,"t:l:p"), iVar1 != 0x6c) {
      if (iVar1 == -1) {
        std::__cxx11::string::string((string *)&local_1060,&logPath);
        Logger::setLogFileName(&local_1060);
        std::__cxx11::string::~string((string *)&local_1060);
        Logger::Logger((Logger *)&mainLoop,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/ruanyvan[P]WebServer/WebServer/Main.cpp"
                       ,0x2a);
        if (8 < (int)local_60 - (int)local_60[0]) {
          *local_60[0] = 0x444145524854505f;
          local_60[0] = local_60[0] + 1;
        }
        Logger::~Logger((Logger *)&mainLoop);
        EventLoop::EventLoop(&mainLoop);
        Server::Server(&myHTTPServer,&mainLoop,local_1084,port);
        Server::start(&myHTTPServer);
        EventLoop::loop(&mainLoop);
        Server::~Server(&myHTTPServer);
        EventLoop::~EventLoop(&mainLoop);
        std::__cxx11::string::~string((string *)&logPath);
        return 0;
      }
      if (iVar1 == 0x70) {
        port = atoi(_optarg);
      }
      else if (iVar1 == 0x74) {
        local_1084 = atoi(_optarg);
      }
    }
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::assign
              (&logPath,_optarg);
  } while ((1 < logPath._M_string_length) && (*_optarg == '/'));
  puts("logPath should start with \"/\"");
  abort();
}

Assistant:

int main(int argc, char* argv[]){
    int threadNum = 4;
    int port = 8088;
    std::string logPath = "./WebServer.log";

    // parse args
    int opt;
    const char* str = "t:l:p";
    while((opt = getopt(argc, argv, str))!=-1){
        switch (opt)
        {
        case 't':{
            threadNum = atoi(optarg);
            break;
        } 
        case 'l':{
            logPath = optarg;
            if(logPath.size() <2 || optarg[0]!= '/'){   // 这要求路径开始必须为：""/"  
                printf("logPath should start with \"/\"\n");
                abort();
            }
            break;
        }
        case 'p':{
            port = atoi(optarg);
            break;
        }
        default:
            break;
        }
    }
    Logger::setLogFileName(logPath);

    // STL库在多线程上使用
#ifndef _PTHREADS
    LOG<<"_PTHREADS is not defined!";
#endif
    EventLoop mainLoop;
    Server myHTTPServer(&mainLoop, threadNum, port);
    myHTTPServer.start();
    mainLoop.loop();
    
    return 0;
}